

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

Token __thiscall Lexer::tokenType(Lexer *this)

{
  TokenInfo *pTVar1;
  
  pTVar1 = token(this);
  return pTVar1->type;
}

Assistant:

inline Token tokenType() const
	{
		return token()->type;
	}